

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordTelemetryLogEvent(EventLog *this,JavascriptString *infoStringJs,bool doPrint)

{
  charcount_t length;
  TelemetryEventLogEntry *into;
  char16 *str;
  TelemetryEventLogEntry *tEvent;
  bool doPrint_local;
  JavascriptString *infoStringJs_local;
  EventLog *this_local;
  
  into = RecordGetInitializedEvent_DataOnly<TTD::NSLogEvents::TelemetryEventLogEntry,(TTD::NSLogEvents::EventKind)4>
                   (this);
  str = Js::JavascriptString::GetString(infoStringJs);
  length = Js::JavascriptString::GetLength(infoStringJs);
  SlabAllocatorBase<8>::CopyStringIntoWLength
            (&this->m_eventSlabAllocator,str,length,&into->InfoString);
  into->DoPrint = doPrint;
  return;
}

Assistant:

void EventLog::RecordTelemetryLogEvent(Js::JavascriptString* infoStringJs, bool doPrint)
    {
        NSLogEvents::TelemetryEventLogEntry* tEvent = this->RecordGetInitializedEvent_DataOnly<NSLogEvents::TelemetryEventLogEntry, NSLogEvents::EventKind::TelemetryLogTag>();
        this->m_eventSlabAllocator.CopyStringIntoWLength(infoStringJs->GetString(), infoStringJs->GetLength(), tEvent->InfoString);
        tEvent->DoPrint = doPrint;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->ForceFlush();
#endif
    }